

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMPTEAnalyzerResults.cpp
# Opt level: O2

void __thiscall
SMPTEAnalyzerResults::GenerateExportFile
          (SMPTEAnalyzerResults *this,char *file,DisplayBase display_base,U32 export_type_user_id)

{
  char cVar1;
  uint uVar2;
  ulonglong uVar3;
  ostream *poVar4;
  ulong uVar5;
  size_t sVar6;
  uint uVar7;
  Frame frame;
  Frame local_360 [40];
  char str [128];
  char time_str [128];
  ofstream file_stream;
  
  std::ofstream::ofstream(&file_stream,file,_S_out);
  uVar3 = Analyzer::GetTriggerSample();
  uVar2 = Analyzer::GetSampleRate();
  poVar4 = std::operator<<((ostream *)&file_stream,"# ");
  poVar4 = std::operator<<(poVar4,"SMPTE/EBU Timecode (BiPhase Mark \'LTC\' 80 bits)");
  poVar4 = std::operator<<(poVar4," / ");
  poVar4 = std::operator<<(poVar4,"0.02 - 2011-08-19");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&file_stream,"Time [s],SMPTE Timestamp HH:MM:SS.frame (flags)"
                          );
  std::endl<char,std::char_traits<char>>(poVar4);
  uVar5 = AnalyzerResults::GetNumFrames();
  uVar7 = 0;
  do {
    if (uVar5 <= uVar7) {
      std::ofstream::close();
LAB_00105745:
      std::ofstream::~ofstream(&file_stream);
      return;
    }
    AnalyzerResults::GetFrame((ulonglong)&frame);
    AnalyzerHelpers::GetTimeString(_frame,uVar3,uVar2,time_str,0x80);
    while( true ) {
      sVar6 = strlen(time_str);
      if (8 < sVar6) break;
      sVar6 = strlen(time_str);
      (time_str + sVar6)[0] = '0';
      (time_str + sVar6)[1] = '\0';
    }
    Frame::Frame(local_360,&frame);
    fillSMPTE(this,local_360,str);
    Frame::~Frame(local_360);
    poVar4 = std::operator<<((ostream *)&file_stream,time_str);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = std::operator<<(poVar4,str);
    std::endl<char,std::char_traits<char>>(poVar4);
    cVar1 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,(ulong)uVar7);
    if (cVar1 != '\0') {
      std::ofstream::close();
      Frame::~Frame(&frame);
      goto LAB_00105745;
    }
    Frame::~Frame(&frame);
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void SMPTEAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
	std::ofstream file_stream( file, std::ios::out );

	U64 trigger_sample = mAnalyzer->GetTriggerSample();
	U32 sample_rate = mAnalyzer->GetSampleRate();

	file_stream << "# " << TITLE << " / " << VERSION << std::endl;
	file_stream << "Time [s],SMPTE Timestamp HH:MM:SS.frame (flags)" << std::endl;

	U64 num_frames = GetNumFrames();
	for( U32 i=0; i < num_frames; i++ )
	{
		Frame frame = GetFrame( i );
		
		char time_str[128];
		AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, 128 );

		while(strlen(time_str)<9)
			strcat(time_str,"0");

		char str[128];
	        fillSMPTE(frame,str);

		file_stream << time_str << "," << str << std::endl;

		if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
		{
			file_stream.close();
			return;
		}
	}

	file_stream.close();
}